

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

void setup_lambdas(warm_cb *data)

{
  vector<float,_std::allocator<float>_> *this;
  pointer pfVar1;
  uint uVar2;
  ulong in_RAX;
  ulong uVar3;
  uint32_t i_1;
  ulong uVar4;
  uint32_t i;
  uint uVar5;
  float fVar6;
  undefined8 uStack_28;
  
  this = &data->lambdas;
  uStack_28 = in_RAX;
  for (uVar5 = 0; uVar2 = data->choices_lambda, uVar5 < uVar2; uVar5 = uVar5 + 1) {
    uStack_28 = uStack_28 & 0xffffffff;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (this,(float *)((long)&uStack_28 + 4));
  }
  if (data->upd_ws == false) {
    if (data->upd_inter != false) {
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
        (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = 1.0;
        uVar2 = data->choices_lambda;
      }
      return;
    }
  }
  else if (data->upd_inter == false) {
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = 0.0;
      uVar2 = data->choices_lambda;
    }
    return;
  }
  fVar6 = 0.5;
  if (1 < data->lambda_scheme - 1U) {
    fVar6 = data->epsilon / (data->epsilon + 1.0);
  }
  (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar2 >> 1] = fVar6;
  uVar3 = (ulong)(uVar2 >> 1);
  uVar4 = uVar3;
  while (uVar4 != 0) {
    pfVar1 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1[(int)uVar4 - 1] = pfVar1[uVar4] * 0.5;
    uVar4 = uVar4 - 1;
  }
  while (uVar4 = uVar3 + 1, uVar4 < data->choices_lambda) {
    pfVar1 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1[uVar4] = (1.0 - pfVar1[uVar3]) * -0.5 + 1.0;
    uVar3 = uVar4;
  }
  if ((data->lambda_scheme == 2) || (data->lambda_scheme == 4)) {
    *(data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
     super__Vector_impl_data._M_start = 0.0;
    (data->lambdas).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[data->choices_lambda - 1] = 1.0;
  }
  return;
}

Assistant:

void setup_lambdas(warm_cb& data)
{
	// The lambdas are arranged in ascending order
	vector<float>& lambdas = data.lambdas;
	for (uint32_t i = 0; i<data.choices_lambda; i++)
		lambdas.push_back(0.f);

	//interaction only: set all lambda's to be identically 1
	if (!data.upd_ws && data.upd_inter)
	{
		for (uint32_t i = 0; i<data.choices_lambda; i++)
			lambdas[i] = 1.0;
		return;
	}

	//warm start only: set all lambda's to be identically 0
	if (!data.upd_inter && data.upd_ws)
	{
		for (uint32_t i = 0; i<data.choices_lambda; i++)
			lambdas[i] = 0.0;
		return;
	}

	uint32_t mid = data.choices_lambda / 2;

	if (data.lambda_scheme == ABS_CENTRAL || data.lambda_scheme == ABS_CENTRAL_ZEROONE)
		lambdas[mid] = 0.5;
	else
		lambdas[mid] = minimax_lambda(data.epsilon);

	for (uint32_t i = mid; i > 0; i--)
		lambdas[i-1] = lambdas[i] / 2.0;

	for (uint32_t i = mid+1; i < data.choices_lambda; i++)
		lambdas[i] = 1 - (1-lambdas[i-1]) / 2.0;

	if (data.lambda_scheme == MINIMAX_CENTRAL_ZEROONE || data.lambda_scheme == ABS_CENTRAL_ZEROONE)
	{
		lambdas[0] = 0.0;
		lambdas[data.choices_lambda-1] = 1.0;
	}
}